

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O1

tuple<bool,_unsigned_int,_unsigned_int> __thiscall V4L2Device::parse_resolution(V4L2Device *this)

{
  Options *this_00;
  pointer pcVar1;
  char *pcVar2;
  char *__nptr;
  int iVar3;
  OptionDetails *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  Writer *pWVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 uVar11;
  undefined1 uVar12;
  long in_RSI;
  int iVar13;
  undefined1 *puVar14;
  tuple<bool,_unsigned_int,_unsigned_int> tVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resolution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> y_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x_str;
  char *local_110;
  ulong local_108;
  char local_100 [16];
  ulong local_f0;
  Writer local_e0;
  char *local_70 [2];
  char local_60 [16];
  char *local_50 [2];
  char local_40 [16];
  
  this_00 = *(Options **)(in_RSI + 0x208);
  local_e0._vptr_Writer = (_func_int **)&local_e0.m_file;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"resolution","");
  this_01 = cxxopts::Options::operator[](this_00,(string *)&local_e0);
  pbVar4 = cxxopts::OptionDetails::as<std::__cxx11::string>(this_01);
  local_110 = local_100;
  pcVar1 = (pbVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + pbVar4->_M_string_length);
  if (local_e0._vptr_Writer != (_func_int **)&local_e0.m_file) {
    operator_delete(local_e0._vptr_Writer);
  }
  lVar5 = std::__cxx11::string::find((char *)&local_110,0x1539c3,0);
  if ((lVar5 == -1) || (local_108 <= lVar5 + 1U)) {
    local_e0._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
    local_e0.m_level = Error;
    local_e0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_e0.m_line = 0x19b;
    local_e0.m_func = "std::tuple<bool, uint32_t, uint32_t> V4L2Device::parse_resolution()";
    local_e0.m_verboseLevel = 0;
    local_e0.m_logger = (Logger *)0x0;
    local_e0.m_proceed = false;
    local_e0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_e0.m_messageBuilder.m_containerLogSeperator = "";
    local_e0.m_dispatchAction = NormalLog;
    local_e0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar8 = el::base::Writer::construct(&local_e0,1,"default");
    if ((pWVar8->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50,
                   "invalid resolution description: ",0x20),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    pcVar2 = local_110;
    if (pWVar8->m_proceed == true) {
      puVar14 = &((pWVar8->m_messageBuilder).m_logger)->field_0x50;
      if (local_110 == (char *)0x0) {
        std::ios::clear((int)puVar14 + (int)*(undefined8 *)(*(long *)puVar14 + -0x18));
      }
      else {
        sVar9 = strlen(local_110);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar14,pcVar2,sVar9);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer(&local_e0);
    iVar13 = 0;
    uVar12 = 0;
    iVar3 = 0;
    uVar11 = extraout_EDX_02;
LAB_001434f4:
    this->fd = iVar13;
    this->frames_taken = iVar3;
    *(undefined1 *)&(this->buffers)._M_elems[0].start = uVar12;
    if (local_110 != local_100) {
      operator_delete(local_110);
      uVar11 = extraout_EDX_03;
    }
    tVar15.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>._8_4_ = uVar11;
    tVar15.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
    return (tuple<bool,_unsigned_int,_unsigned_int>)
           tVar15.super__Tuple_impl<0UL,_bool,_unsigned_int,_unsigned_int>;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)&local_110);
  std::__cxx11::string::substr((ulong)local_70,(ulong)&local_110);
  __nptr = local_50[0];
  piVar6 = __errno_location();
  iVar3 = *piVar6;
  *piVar6 = 0;
  uVar7 = strtoul(__nptr,(char **)&local_e0,10);
  pcVar2 = local_70[0];
  if (local_e0._vptr_Writer == (_func_int **)__nptr) {
    std::__throw_invalid_argument("stoul");
  }
  else {
    local_f0 = uVar7;
    if (*piVar6 == 0) {
      *piVar6 = iVar3;
    }
    else if (*piVar6 == 0x22) {
      std::__throw_out_of_range("stoul");
    }
    iVar3 = *piVar6;
    *piVar6 = 0;
    uVar7 = strtoul(local_70[0],(char **)&local_e0,10);
    if (local_e0._vptr_Writer != (_func_int **)pcVar2) {
      iVar13 = (int)uVar7;
      if (*piVar6 == 0) {
        *piVar6 = iVar3;
      }
      else if (*piVar6 == 0x22) {
        std::__throw_out_of_range("stoul");
      }
      uVar12 = 1;
      uVar11 = extraout_EDX;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
        uVar11 = extraout_EDX_00;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
        uVar11 = extraout_EDX_01;
      }
      iVar3 = (int)local_f0;
      goto LAB_001434f4;
    }
  }
  uVar10 = std::__throw_invalid_argument("stoul");
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

std::tuple<bool, uint32_t, uint32_t>
    parse_resolution()
    {
        uint32_t x = 0, y = 0;
        bool ok = true;

        auto resolution = (*options)["resolution"].as<std::string>();
        auto delimeter = resolution.find("x");

        if ((delimeter != std::string::npos) and (delimeter + 1 < resolution.size())) {
            auto x_str = resolution.substr(0, delimeter);
            auto y_str = resolution.substr(delimeter + 1, resolution.size() - 1);

            try {
                x = std::stoul(x_str);
                y = std::stoul(y_str);
            } catch (std::invalid_argument& exc) {
                LOG(ERROR) << "no conversion could be performed: " << exc.what();
                ok = false;
            } catch (std::out_of_range& exc) {
                LOG(ERROR) << "out of range error: " << exc.what();
                ok = false;
            }
        } else {
            LOG(ERROR) << "invalid resolution description: " << resolution;
            ok = false;
        }

        return std::make_tuple(ok, x, y);
    }